

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchmanager.cpp
# Opt level: O1

void __thiscall QEvdevTouchManager::addDevice(QEvdevTouchManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  QEvdevTouchScreenHandlerThread *this_00;
  undefined4 *puVar3;
  long in_FS_OFFSET;
  QEvdevTouchScreenHandlerThread *local_78;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [8];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevTouch();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar1->name;
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 0;
    uVar2 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"evdevtouch: Adding device at %ls",uVar2);
  }
  this_00 = (QEvdevTouchScreenHandlerThread *)operator_new(0x68);
  QEvdevTouchScreenHandlerThread::QEvdevTouchScreenHandlerThread
            (this_00,deviceNode,&this->m_spec,(QObject *)0x0);
  local_70 = updateInputDeviceCount;
  local_68 = (ImplFn)0x0;
  local_58 = 0x1296c0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QCallableObject<void_(QEvdevTouchManager::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = updateInputDeviceCount;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this_00,(QObject *)&local_58,(void **)this,
             (QSlotObjectBase *)&local_70,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_78 = this_00;
  QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::add
            (&this->m_activeDevices,deviceNode,
             (unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
              )&local_78);
  if (local_78 != (QEvdevTouchScreenHandlerThread *)0x0) {
    (**(code **)(*(long *)local_78 + 0x20))();
  }
  local_78 = (QEvdevTouchScreenHandlerThread *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTouchManager::addDevice(const QString &deviceNode)
{
    qCDebug(qLcEvdevTouch, "evdevtouch: Adding device at %ls", qUtf16Printable(deviceNode));
    auto handler = std::make_unique<QEvdevTouchScreenHandlerThread>(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevTouchScreenHandlerThread::touchDeviceRegistered, this, &QEvdevTouchManager::updateInputDeviceCount);
        m_activeDevices.add(deviceNode, std::move(handler));
    } else {
        qWarning("evdevtouch: Failed to open touch device %ls", qUtf16Printable(deviceNode));
    }
}